

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O0

ptr<snapshot> nuraft::snapshot::deserialize(buffer_serializer *bs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ptr<snapshot> pVar1;
  ptr<cluster_config> conf;
  ulong size;
  ulong last_log_term;
  ulong last_log_idx;
  type snp_type;
  element_type *args_3;
  shared_ptr<nuraft::cluster_config> *args_2;
  unsigned_long *in_stack_ffffffffffffffb0;
  unsigned_long *in_stack_ffffffffffffffb8;
  element_type *in_stack_ffffffffffffffc0;
  buffer_serializer *in_stack_ffffffffffffffd0;
  
  args_3 = in_RDI;
  buffer_serializer::get_u8((buffer_serializer *)in_stack_ffffffffffffffc0);
  buffer_serializer::get_u64(in_stack_ffffffffffffffd0);
  buffer_serializer::get_u64(in_stack_ffffffffffffffd0);
  buffer_serializer::get_u64(in_stack_ffffffffffffffd0);
  args_2 = (shared_ptr<nuraft::cluster_config> *)&stack0xffffffffffffffc0;
  cluster_config::deserialize((buffer_serializer *)last_log_idx);
  cs_new<nuraft::snapshot,unsigned_long&,unsigned_long&,std::shared_ptr<nuraft::cluster_config>&,unsigned_long&,nuraft::snapshot::type&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,args_2,&args_3->last_log_idx_,
             (type *)in_RDI);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x2bce08);
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<snapshot>)pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> snapshot::deserialize(buffer_serializer& bs) {
    type snp_type = static_cast<type>(bs.get_u8());
    ulong last_log_idx = bs.get_u64();
    ulong last_log_term = bs.get_u64();
    ulong size = bs.get_u64();
    ptr<cluster_config> conf( cluster_config::deserialize(bs) );
    return cs_new<snapshot>(last_log_idx, last_log_term, conf, size, snp_type);
}